

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_implementation.hpp
# Opt level: O2

event_queue_t * __thiscall
so_5::disp::thread_pool::common_implementation::
dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
::bind_agent_with_cooperation_fifo
          (dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
           *this,agent_ref_t *agent,bind_params_t *params)

{
  anon_class_16_2_515617ac rollback_action;
  string *psVar1;
  string *coop_name;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>_>,_bool>
  pVar2;
  undefined1 local_68 [8];
  iterator it;
  cooperation_data_t in_stack_ffffffffffffffc0;
  
  psVar1 = agent_t::so_coop_name_abi_cxx11_(agent->m_obj);
  it._M_node = (_Base_ptr)
               std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>_>_>
               ::find(&(this->m_cooperations)._M_t,psVar1);
  if ((_Rb_tree_header *)it._M_node == &(this->m_cooperations)._M_t._M_impl.super__Rb_tree_header) {
    psVar1 = agent_t::so_coop_name_abi_cxx11_(agent->m_obj);
    make_new_agent_queue
              ((dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
                *)local_68,(bind_params_t *)this);
    coop_name = agent_t::so_coop_name_abi_cxx11_(agent->m_obj);
    cooperation_data_t::cooperation_data_t
              ((cooperation_data_t *)&stack0xffffffffffffffc0,(agent_queue_ref_t *)local_68,1,
               &(this->m_data_source).m_prefix,coop_name);
    pVar2 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>,std::_Select1st<std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>>>
            ::
            _M_emplace_unique<std::__cxx11::string_const&,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>,std::_Select1st<std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::cooperation_data_t>>>
                        *)&this->m_cooperations,psVar1,
                       (cooperation_data_t *)&stack0xffffffffffffffc0);
    it._M_node = (_Base_ptr)pVar2.first._M_node;
    cooperation_data_t::~cooperation_data_t((cooperation_data_t *)&stack0xffffffffffffffc0);
    intrusive_ptr_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>::dismiss_object
              ((intrusive_ptr_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *)local_68);
  }
  else {
    it._M_node[2]._M_parent = (_Base_ptr)((long)&(it._M_node[2]._M_parent)->_M_color + 1);
  }
  rollback_action.this =
       (dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,_so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,_so_5::disp::adv_thread_pool::impl::agent_queue_t,_so_5::disp::adv_thread_pool::bind_params_t,_so_5::disp::adv_thread_pool::impl::adaptation_t>
        *)&it;
  rollback_action.it = (iterator *)agent;
  details::
  do_with_rollback_on_exception<so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::bind_agent_with_cooperation_fifo(so_5::intrusive_ptr_t<so_5::agent_t>,so_5::disp::adv_thread_pool::bind_params_t_const&)::_lambda()_1_,so_5::disp::thread_pool::common_implementation::dispatcher_t<so_5::disp::adv_thread_pool::impl::work_thread_details::work_thread_template_t<so_5::disp::adv_thread_pool::impl::work_thread_details::with_activity_tracking_impl_t>,so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>,so_5::disp::adv_thread_pool::impl::agent_queue_t,so_5::disp::adv_thread_pool::bind_params_t,so_5::disp::adv_thread_pool::impl::adaptation_t>::bind_agent_with_cooperation_fifo(so_5::intrusive_ptr_t<so_5::agent_t>,so_5::disp::adv_thread_pool::bind_params_t_const&)::_lambda()_2_>
            ((anon_class_24_3_386d7799)in_stack_ffffffffffffffc0,rollback_action);
  return *(event_queue_t **)(it._M_node + 2);
}

Assistant:

event_queue_t *
		bind_agent_with_cooperation_fifo(
			agent_ref_t agent,
			const PARAMS & params )
			{
				auto it = m_cooperations.find( agent->so_coop_name() );
				if( it == m_cooperations.end() )
					it = m_cooperations.emplace(
							agent->so_coop_name(),
							cooperation_data_t(
									make_new_agent_queue( params ),
									1,
									m_data_source.prefix(),
									agent->so_coop_name() ) )
							.first;
				else
					it->second.m_agents += 1;

				so_5::details::do_with_rollback_on_exception(
						[&] {
							m_agents.emplace(
									agent.get(),
									agent_data_t{ it->second.m_queue } );
						},
						[&] {
							// Rollback m_cooperations modification.
							if( 0 == --(it->second.m_agents) )
								m_cooperations.erase( it );
						} );

				return it->second.m_queue.get();
			}